

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

String * Process::getExecutablePath(void)

{
  uint uVar1;
  usize len_00;
  String *in_RDI;
  ssize_t len;
  char path [4097];
  char local_38 [8];
  char procFilePath [32];
  
  uVar1 = getpid();
  sprintf(local_38,"/proc/%d/exe",(ulong)uVar1);
  len_00 = readlink(local_38,(char *)&len,0x1001);
  if (len_00 == 0xffffffffffffffff) {
    String::String(in_RDI);
  }
  else {
    String::fromCString(in_RDI,(char *)&len,len_00);
  }
  return in_RDI;
}

Assistant:

String Process::getExecutablePath()
{
#ifdef _WIN32
  char path[MAX_PATH + 1];
  DWORD len = GetModuleFileName(NULL, path, sizeof(path) / sizeof(*path));
  if (len != sizeof(path) / sizeof(*path))
    return String::fromCString(path, len);
  Buffer buffer;
  buffer.resize((MAX_PATH << 1) * sizeof(char));
  for (;;)
  {
    DWORD len = GetModuleFileName(NULL, (char*)(byte*)buffer, (DWORD)buffer.size());
    if (len != buffer.size() / sizeof(char))
      return String::fromCString(path, len);
    buffer.resize(buffer.size() << 1);
  }
#else
  char procFilePath[32];
  sprintf(procFilePath, "/proc/%d/exe", getpid());
  char path[PATH_MAX + 1];
  ssize_t len = readlink(procFilePath, path, sizeof(path));
  if (len == -1)
    return String();
  return String::fromCString(path, len);
#endif
}